

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaPrivate::setViewMode(QMdiAreaPrivate *this,ViewMode mode)

{
  QPointer<QMdiSubWindow> *pQVar1;
  long lVar2;
  bool bVar3;
  Shape shape;
  QMdiAreaTabBar *pQVar4;
  QWidget *pQVar5;
  qsizetype qVar6;
  long lVar7;
  long lVar8;
  QMdiSubWindow *subWindow;
  long in_FS_OFFSET;
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QMdiSubWindow *current;
  undefined1 local_58 [8];
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_50;
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if ((this->viewMode != mode) && (this->inViewModeChange == false)) {
    pQVar5 = *(QWidget **)
              &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
               field_0x8;
    this->inViewModeChange = true;
    if (mode == TabbedView) {
      pQVar4 = (QMdiAreaTabBar *)operator_new(0x28);
      QMdiAreaTabBar::QMdiAreaTabBar(pQVar4,pQVar5);
      this->tabBar = pQVar4;
      QTabBar::setDocumentMode((QTabBar *)pQVar4,this->documentMode);
      QTabBar::setTabsClosable(&this->tabBar->super_QTabBar,this->tabsClosable);
      QTabBar::setMovable(&this->tabBar->super_QTabBar,this->tabsMovable);
      pQVar4 = this->tabBar;
      shape = _q_tb_tabBarShapeFrom(this->tabShape,this->tabPosition);
      QTabBar::setShape(&pQVar4->super_QTabBar,shape);
      this->isSubWindowsTiled = false;
      local_50.d = (this->childWindows).d.d;
      pQVar1 = (this->childWindows).d.ptr;
      local_50.size = (this->childWindows).d.size;
      if (local_50.d != (Data *)0x0) {
        LOCK();
        ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar7 = local_50.size << 4;
      local_50.ptr = pQVar1;
      for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 0x10) {
        lVar2 = *(long *)((long)&(pQVar1->wp).d + lVar8);
        if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
          subWindow = (QMdiSubWindow *)0x0;
        }
        else {
          subWindow = *(QMdiSubWindow **)((long)&(pQVar1->wp).value + lVar8);
        }
        pQVar4 = this->tabBar;
        QWidget::windowIcon((QWidget *)local_58);
        tabTextFor((QString *)&current,subWindow);
        QTabBar::addTab(&pQVar4->super_QTabBar,(QIcon *)local_58,(QString *)&current);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&current);
        QIcon::~QIcon((QIcon *)local_58);
      }
      current = QMdiArea::currentSubWindow((QMdiArea *)pQVar5);
      if (current == (QMdiSubWindow *)0x0) {
        this->viewMode = TabbedView;
      }
      else {
        pQVar4 = this->tabBar;
        qVar6 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                          (&this->childWindows,&current,0);
        QTabBar::setCurrentIndex(&pQVar4->super_QTabBar,(int)qVar6);
        bVar3 = QWidget::isMaximized(&current->super_QWidget);
        if (bVar3) {
          QWidget::showNormal(&current->super_QWidget);
        }
        this->viewMode = TabbedView;
        if ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x3b4) & 1) == 0) {
          QWidget::showMaximized(&current->super_QWidget);
        }
      }
      if ((pQVar5->data->widget_attributes & 0x8000) != 0) {
        QWidget::show((QWidget *)this->tabBar);
      }
      updateTabBarGeometry(this);
      QObject::connect(local_78,(char *)this->tabBar,(QObject *)"2currentChanged(int)",
                       (char *)pQVar5,0x65f80f);
      QMetaObject::Connection::~Connection((Connection *)local_78);
      QObject::connect(local_80,(char *)this->tabBar,(QObject *)"2tabCloseRequested(int)",
                       (char *)pQVar5,0x65f842);
      QMetaObject::Connection::~Connection((Connection *)local_80);
      QObject::connect(local_88,(char *)this->tabBar,(QObject *)"2tabMoved(int,int)",(char *)pQVar5,
                       0x65f867);
      QMetaObject::Connection::~Connection((Connection *)local_88);
      QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_50);
    }
    else {
      if (this->tabBar != (QMdiAreaTabBar *)0x0) {
        (**(code **)(*(long *)&(this->tabBar->super_QTabBar).super_QWidget + 0x20))();
      }
      this->tabBar = (QMdiAreaTabBar *)0x0;
      this->viewMode = mode;
      QAbstractScrollArea::setViewportMargins((QAbstractScrollArea *)pQVar5,0,0,0,0);
      this->indexToLastActiveTab = -1;
      pQVar5 = &QMdiArea::currentSubWindow((QMdiArea *)pQVar5)->super_QWidget;
      if (pQVar5 != (QWidget *)0x0) {
        bVar3 = QWidget::isMaximized(pQVar5);
        if (bVar3) {
          QWidget::showNormal(pQVar5);
        }
      }
    }
    this->inViewModeChange = false;
  }
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::setViewMode(QMdiArea::ViewMode mode)
{
    Q_Q(QMdiArea);
    if (viewMode == mode || inViewModeChange)
        return;

    // Just a guard since we cannot set viewMode = mode here.
    inViewModeChange = true;

#if QT_CONFIG(tabbar)
    if (mode == QMdiArea::TabbedView) {
        Q_ASSERT(!tabBar);
        tabBar = new QMdiAreaTabBar(q);
        tabBar->setDocumentMode(documentMode);
        tabBar->setTabsClosable(tabsClosable);
        tabBar->setMovable(tabsMovable);
#if QT_CONFIG(tabwidget)
        tabBar->setShape(_q_tb_tabBarShapeFrom(tabShape, tabPosition));
#endif

        isSubWindowsTiled = false;

        // Take a copy as tabBar->addTab() will (indirectly) create a connection between
        // the tab close button clicked() signal and the _q_closeTab() slot, which may
        // indirectly call QCoreApplication::sendEvent(), the latter could result in
        // invoking unknown code that could e.g. recurse into the class modifying childWindows.
        const auto subWindows = childWindows;
        for (QMdiSubWindow *subWindow : subWindows)
            tabBar->addTab(subWindow->windowIcon(), tabTextFor(subWindow));

        QMdiSubWindow *current = q->currentSubWindow();
        if (current) {
            tabBar->setCurrentIndex(childWindows.indexOf(current));
            // Restore sub-window (i.e. cleanup buttons in menu bar and window title).
            if (current->isMaximized())
                current->showNormal();

            viewMode = mode;

            // Now, maximize it.
            if (!q->testOption(QMdiArea::DontMaximizeSubWindowOnActivation)) {
                current->showMaximized();
            }
        } else {
            viewMode = mode;
        }

        if (q->isVisible())
            tabBar->show();
        updateTabBarGeometry();

        QObject::connect(tabBar, SIGNAL(currentChanged(int)), q, SLOT(_q_currentTabChanged(int)));
        QObject::connect(tabBar, SIGNAL(tabCloseRequested(int)), q, SLOT(_q_closeTab(int)));
        QObject::connect(tabBar, SIGNAL(tabMoved(int,int)), q, SLOT(_q_moveTab(int,int)));
    } else
#endif // QT_CONFIG(tabbar)
    { // SubWindowView
#if QT_CONFIG(tabbar)
        delete tabBar;
        tabBar = nullptr;
#endif // QT_CONFIG(tabbar)

        viewMode = mode;
        q->setViewportMargins(0, 0, 0, 0);
        indexToLastActiveTab = -1;

        QMdiSubWindow *current = q->currentSubWindow();
        if (current && current->isMaximized())
            current->showNormal();
    }

    Q_ASSERT(viewMode == mode);
    inViewModeChange = false;
}